

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

locale * __thiscall
boost::xpressive::cpp_regex_traits<char>::imbue(cpp_regex_traits<char> *this,locale_type *loc)

{
  ctype *pcVar1;
  locale *in_RDX;
  long in_RSI;
  locale *this_00;
  locale *in_RDI;
  locale_type *old_loc;
  locale *in_stack_000002b8;
  cpp_regex_traits_base<char,_1UL> *in_stack_000002c0;
  
  this_00 = (locale *)(in_RSI + 0x200);
  std::locale::locale(in_RDI,this_00);
  std::locale::operator=(this_00,in_RDX);
  pcVar1 = std::use_facet<std::ctype<char>>(this_00);
  *(ctype **)(in_RSI + 0x208) = pcVar1;
  detail::cpp_regex_traits_base<char,_1UL>::imbue(in_stack_000002c0,in_stack_000002b8);
  return in_RDI;
}

Assistant:

locale_type imbue(locale_type loc)
    {
        locale_type old_loc = this->loc_;
        this->loc_ = loc;
        this->ctype_ = &BOOST_USE_FACET(std::ctype<char_type>, this->loc_);
        //this->collate_ = &BOOST_USE_FACET(std::collate<char_type>, this->loc_);
        this->base_type::imbue(this->loc_);
        return old_loc;
    }